

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asteroid.cpp
# Opt level: O0

bool __thiscall Asteroid::logic(Asteroid *this,int step)

{
  Entity *pEVar1;
  int in_ESI;
  Entity *in_RDI;
  Player *p;
  undefined4 in_stack_00000010;
  Entity *in_stack_00000040;
  Entity *pEVar2;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar3;
  int step_00;
  
  *(float *)&in_RDI[1]._vptr_Entity =
       -*(float *)&in_RDI->field_0x34 * (float)in_ESI + *(float *)&in_RDI[1]._vptr_Entity;
  pEVar2 = in_RDI;
  pEVar1 = Entity::getPlayerCollision(in_stack_00000040);
  step_00 = (int)((ulong)pEVar2 >> 0x20);
  if (pEVar1 == (Entity *)0x0) {
    in_RDI->dx = *(float *)((long)&in_RDI[1]._vptr_Entity + 4) * (float)in_ESI;
    in_RDI->dy = in_RDI[1].x * (float)in_ESI;
    Entity::wrap(in_RDI);
    bVar3 = Entity::logic((Entity *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                          step_00);
    if (bVar3) {
      bVar3 = true;
    }
    else {
      bVar3 = false;
    }
  }
  else {
    Entity::explode((Entity *)CONCAT44(step,in_stack_00000010));
    (*pEVar1->_vptr_Entity[4])(pEVar1,1);
    my_play_sample((int)((ulong)pEVar1 >> 0x20));
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool Asteroid::logic(int step)
{
   angle -= da * step;

   Player *p = (Player *)getPlayerCollision();
   if (p) {
      explode();
      p->hit(1);
      my_play_sample(RES_COLLISION);
      return false;
   }

   dx = speed_x * step;
   dy = speed_y * step;

   Entity::wrap();

   if (!Entity::logic(step))
      return false;

   return true;
}